

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O0

void memory_tree_ns::experience_replay(memory_tree *b,single_learner *base)

{
  int iVar1;
  long in_RDI;
  uint32_t *unaff_retaddr;
  v_array<unsigned_int> tmp_path;
  int ec_id;
  uint32_t cn;
  uint32_t in_stack_0000004c;
  uint32_t *in_stack_00000050;
  single_learner *in_stack_00000058;
  memory_tree *in_stack_00000060;
  v_array<unsigned_int> *in_stack_ffffffffffffffc0;
  bool fake_insert;
  
  iVar1 = random_sample_example_pop((memory_tree *)tmp_path._begin,unaff_retaddr);
  if (-1 < iVar1) {
    fake_insert = SUB81((ulong)in_RDI >> 0x38,0);
    if (*(long *)(in_RDI + 0xb8) == 0) {
      insert_example((memory_tree *)tmp_path._end,(single_learner *)tmp_path._begin,unaff_retaddr,
                     fake_insert);
    }
    else if (*(int *)(in_RDI + 0xd0) == 0) {
      v_init<unsigned_int>();
      route_to_leaf(in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_0000004c,
                    (v_array<unsigned_int> *)b,base._7_1_);
      v_array<unsigned_int>::delete_v(in_stack_ffffffffffffffc0);
    }
    else {
      insert_example((memory_tree *)tmp_path._end,(single_learner *)tmp_path._begin,unaff_retaddr,
                     fake_insert);
    }
  }
  return;
}

Assistant:

void experience_replay(memory_tree& b, single_learner& base)
    {
        uint32_t cn = 0; //start from root, randomly descent down! 
	    int ec_id = random_sample_example_pop(b,cn);
	    if (ec_id >= 0){
            if (b.current_pass < 1)
            	insert_example(b, base, ec_id); //unsupervised learning
            else{
		if (b.dream_at_update == false){
	        	v_array<uint32_t> tmp_path = v_init<uint32_t>();
			route_to_leaf(b, base, ec_id, 0, tmp_path, true);
			tmp_path.delete_v();
		}
		else{
                	insert_example(b, base, ec_id);
		}
            }
        }
    }